

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall testing::Action<unsigned_int_()>::Perform(Action<unsigned_int_()> *this)

{
  bool bVar1;
  uint uVar2;
  Action<unsigned_int_()> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    testing::internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  uVar2 = testing::internal::Apply<std::function<unsigned_int()>const&,std::tuple<>>
                    (&this->fun_,(tuple<> *)((long)&this_local + 7));
  return uVar2;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }